

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_space.cpp
# Opt level: O2

uint mylog2(size_t n)

{
  uint bits;
  
  bits = 0;
  for (; 1 < n; n = n >> 1) {
    bits = bits + 1;
  }
  return bits;
}

Assistant:

static unsigned mylog2(size_t n)
{
	unsigned bits = 0;
	while (n > 1) {
		bits++;
		n >>= 1;
	}
	return bits;
}